

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O3

bool write_to_descriptor(int desc,char *txt,int length)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  int *piVar4;
  uint uVar5;
  string_view fmt;
  char *local_30;
  
  if (length < 1) {
    sVar2 = strlen(txt);
    length = (int)sVar2;
    if (length < 1) {
      return true;
    }
  }
  uVar5 = 0;
  while( true ) {
    iVar1 = length - uVar5;
    if (0xfff < iVar1) {
      iVar1 = 0x1000;
    }
    sVar3 = write(desc,txt + uVar5,(long)iVar1);
    if ((int)sVar3 < 0) break;
    uVar5 = uVar5 + (int)sVar3;
    if (length <= (int)uVar5) {
      return true;
    }
  }
  piVar4 = __errno_location();
  local_30 = strerror(*piVar4);
  fmt._M_str = "Write_to_descriptor: write: {}";
  fmt._M_len = 0x1e;
  CLogger::Warn<char*>((CLogger *)&RS.field_0x140,fmt,&local_30);
  return false;
}

Assistant:

bool write_to_descriptor(int desc, char *txt, int length)
{
	int iStart;
	int nWrite;
	int nBlock;

	if (length <= 0)
		length = strlen(txt);

	for (iStart = 0; iStart < length; iStart += nWrite)
	{
		nBlock = std::min(length - iStart, 4096);
		if ((nWrite = write(desc, txt + iStart, nBlock)) < 0)
		{
			RS.Logger.Warn("Write_to_descriptor: write: {}", std::strerror(errno));
			return false;
		}
	}

	return true;
}